

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu.cpp
# Opt level: O2

IMemBank * __thiscall n_e_s::core::Mmu::get_mem_bank(Mmu *this,uint16_t addr)

{
  pointer puVar1;
  int iVar2;
  IMemBank *pIVar3;
  long lVar4;
  long lVar5;
  pointer puVar6;
  pointer puVar7;
  
  puVar7 = (this->mem_banks_).
           super__Vector_base<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>,_std::allocator<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->mem_banks_).
           super__Vector_base<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>,_std::allocator<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar4 = (long)puVar1 - (long)puVar7;
  for (lVar5 = lVar4 >> 5; puVar6 = puVar7, 0 < lVar5; lVar5 = lVar5 + -1) {
    pIVar3 = (puVar7->_M_t).
             super___uniq_ptr_impl<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>
             ._M_t.
             super__Tuple_impl<0UL,_n_e_s::core::IMemBank_*,_std::default_delete<n_e_s::core::IMemBank>_>
             .super__Head_base<0UL,_n_e_s::core::IMemBank_*,_false>._M_head_impl;
    iVar2 = (*pIVar3->_vptr_IMemBank[2])(pIVar3,addr);
    if ((char)iVar2 != '\0') goto LAB_0010de2b;
    pIVar3 = puVar7[1]._M_t.
             super___uniq_ptr_impl<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>
             ._M_t.
             super__Tuple_impl<0UL,_n_e_s::core::IMemBank_*,_std::default_delete<n_e_s::core::IMemBank>_>
             .super__Head_base<0UL,_n_e_s::core::IMemBank_*,_false>._M_head_impl;
    iVar2 = (*pIVar3->_vptr_IMemBank[2])(pIVar3,addr);
    if ((char)iVar2 != '\0') {
      puVar6 = puVar7 + 1;
      goto LAB_0010de2b;
    }
    pIVar3 = puVar7[2]._M_t.
             super___uniq_ptr_impl<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>
             ._M_t.
             super__Tuple_impl<0UL,_n_e_s::core::IMemBank_*,_std::default_delete<n_e_s::core::IMemBank>_>
             .super__Head_base<0UL,_n_e_s::core::IMemBank_*,_false>._M_head_impl;
    iVar2 = (*pIVar3->_vptr_IMemBank[2])(pIVar3,addr);
    if ((char)iVar2 != '\0') {
      puVar6 = puVar7 + 2;
      goto LAB_0010de2b;
    }
    pIVar3 = puVar7[3]._M_t.
             super___uniq_ptr_impl<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>
             ._M_t.
             super__Tuple_impl<0UL,_n_e_s::core::IMemBank_*,_std::default_delete<n_e_s::core::IMemBank>_>
             .super__Head_base<0UL,_n_e_s::core::IMemBank_*,_false>._M_head_impl;
    iVar2 = (*pIVar3->_vptr_IMemBank[2])(pIVar3,addr);
    if ((char)iVar2 != '\0') {
      puVar6 = puVar7 + 3;
      goto LAB_0010de2b;
    }
    puVar7 = puVar7 + 4;
    lVar4 = lVar4 + -0x20;
  }
  lVar4 = lVar4 >> 3;
  if (lVar4 != 1) {
    if (lVar4 != 2) {
      puVar6 = puVar1;
      if ((lVar4 != 3) ||
         (pIVar3 = (puVar7->_M_t).
                   super___uniq_ptr_impl<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_n_e_s::core::IMemBank_*,_std::default_delete<n_e_s::core::IMemBank>_>
                   .super__Head_base<0UL,_n_e_s::core::IMemBank_*,_false>._M_head_impl,
         iVar2 = (*pIVar3->_vptr_IMemBank[2])(pIVar3,addr), puVar6 = puVar7, (char)iVar2 != '\0'))
      goto LAB_0010de2b;
      puVar6 = puVar7 + 1;
    }
    pIVar3 = (puVar6->_M_t).
             super___uniq_ptr_impl<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>
             ._M_t.
             super__Tuple_impl<0UL,_n_e_s::core::IMemBank_*,_std::default_delete<n_e_s::core::IMemBank>_>
             .super__Head_base<0UL,_n_e_s::core::IMemBank_*,_false>._M_head_impl;
    iVar2 = (*pIVar3->_vptr_IMemBank[2])(pIVar3,addr);
    if ((char)iVar2 != '\0') goto LAB_0010de2b;
    puVar7 = puVar6 + 1;
  }
  pIVar3 = (puVar7->_M_t).
           super___uniq_ptr_impl<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>
           ._M_t.
           super__Tuple_impl<0UL,_n_e_s::core::IMemBank_*,_std::default_delete<n_e_s::core::IMemBank>_>
           .super__Head_base<0UL,_n_e_s::core::IMemBank_*,_false>._M_head_impl;
  iVar2 = (*pIVar3->_vptr_IMemBank[2])(pIVar3,addr);
  puVar6 = puVar1;
  if ((char)iVar2 != '\0') {
    puVar6 = puVar7;
  }
LAB_0010de2b:
  if (puVar6 == (this->mem_banks_).
                super__Vector_base<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>,_std::allocator<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    pIVar3 = (IMemBank *)0x0;
  }
  else {
    pIVar3 = (puVar6->_M_t).
             super___uniq_ptr_impl<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>
             ._M_t.
             super__Tuple_impl<0UL,_n_e_s::core::IMemBank_*,_std::default_delete<n_e_s::core::IMemBank>_>
             .super__Head_base<0UL,_n_e_s::core::IMemBank_*,_false>._M_head_impl;
  }
  return pIVar3;
}

Assistant:

IMemBank *Mmu::get_mem_bank(uint16_t addr) const {
    auto it = std::find_if(begin(mem_banks_), end(mem_banks_), equal(addr));
    if (it != end(mem_banks_)) {
        return (*it).get();
    }

    return nullptr;
}